

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          TPZSkylMatrix<std::complex<long_double>_> *A)

{
  TPZSkylMatrix<std::complex<long_double>_> *in_RDI;
  TPZSkylMatrix<std::complex<long_double>_> *unaff_retaddr;
  int64_t in_stack_00000018;
  TPZVec<std::complex<long_double>_> *in_stack_00000020;
  int64_t in_stack_ffffffffffffffb8;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  TPZSkylMatrix<std::complex<long_double>_> *A_00;
  
  A_00 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZSkylMatrix<std::complex<long_double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZMatrix<std::complex<long_double>_>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             &in_RDI->super_TPZMatrix<std::complex<long_double>_>);
  (in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_02414eb0;
  TPZVec<std::complex<long_double>_*>::TPZVec
            ((TPZVec<std::complex<long_double>_*> *)in_RDI,in_stack_ffffffffffffffb8);
  TPZVec<std::complex<long_double>_>::TPZVec(in_stack_00000020,in_stack_00000018);
  Copy(unaff_retaddr,A_00);
  return;
}

Assistant:

TPZSkylMatrix(const TPZSkylMatrix<TVar> &A ) : TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fStorage(0)  { Copy(A); }